

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *assertion_result,
          char *expression_text,char *actual_predicate_value,char *expected_predicate_value)

{
  Message *pMVar1;
  char *pcVar2;
  char *actual_message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  AssertionResult *local_20;
  
  if (*(undefined8 **)(this + 8) == (undefined8 *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = (char *)**(undefined8 **)(this + 8);
  }
  local_38 = pcVar2;
  local_30 = actual_predicate_value;
  local_28 = expression_text;
  local_20 = assertion_result;
  Message::Message((Message *)&local_40);
  std::operator<<((ostream *)(local_40._M_head_impl + 0x10),"Value of: ");
  pMVar1 = Message::operator<<((Message *)&local_40,(char **)&local_20);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [12])"\n  Actual: ");
  Message::operator<<(pMVar1,&local_28);
  if (*pcVar2 != '\0') {
    std::operator<<((ostream *)(local_40._M_head_impl + 0x10)," (");
    pMVar1 = Message::operator<<((Message *)&local_40,&local_38);
    Message::operator<<(pMVar1,(char (*) [2])0x13766e);
  }
  std::operator<<((ostream *)(local_40._M_head_impl + 0x10),"\nExpected: ");
  Message::operator<<((Message *)&local_40,&local_30);
  StringStreamToString(__return_storage_ptr__,local_40._M_head_impl);
  if (local_40._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result, const char* expression_text,
    const char* actual_predicate_value, const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0') msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}